

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscanf.c
# Opt level: O0

int vnscan_fn(INPUTFN inputfn,char *string,size_t count,char *format,__va_list_tag *arglist)

{
  char *pcVar1;
  int *piVar2;
  int _Expr_val_1;
  int _Expr_val;
  size_t length;
  int retval;
  miniFILE *infile;
  miniFILE str;
  __va_list_tag *arglist_local;
  char *format_local;
  size_t count_local;
  char *string_local;
  INPUTFN inputfn_local;
  
  str._24_8_ = arglist;
  pcVar1 = (char *)strlen(string);
  if ((string == (char *)0x0) && (sMBUSafeCRTAssertFunc != (tSafeCRT_AssertFuncPtr)0x0)) {
    (*sMBUSafeCRTAssertFunc)
              ("\"(string != NULL)\"","SafeCRT assert failed",
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/safecrt/sscanf.c"
               ,0x53);
  }
  if (string != (char *)0x0) {
    if ((format == (char *)0x0) && (sMBUSafeCRTAssertFunc != (tSafeCRT_AssertFuncPtr)0x0)) {
      (*sMBUSafeCRTAssertFunc)
                ("\"(format != NULL)\"","SafeCRT assert failed",
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/safecrt/sscanf.c"
                 ,0x54);
    }
    if (format != (char *)0x0) {
      str._base._0_4_ = 0xd;
      format_local = (char *)count;
      if (pcVar1 < count) {
        format_local = pcVar1;
      }
      if (format_local < (char *)0x80000000) {
        str._ptr._0_4_ = SUB84(format_local,0);
      }
      else {
        str._ptr._0_4_ = 0x7fffffff;
      }
      infile = (miniFILE *)string;
      str._8_8_ = string;
      inputfn_local._4_4_ =
           (*inputfn)((miniFILE *)&infile,(uchar *)format,(__va_list_tag *)str._24_8_);
    }
    else {
      piVar2 = __errno_location();
      *piVar2 = 0x16;
      if (sMBUSafeCRTAssertFunc != (tSafeCRT_AssertFuncPtr)0x0) {
        (*sMBUSafeCRTAssertFunc)
                  ("\"(format != NULL)\"","SafeCRT assert failed",
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/safecrt/sscanf.c"
                   ,0x54);
      }
      inputfn_local._4_4_ = -1;
    }
  }
  else {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
    if (sMBUSafeCRTAssertFunc != (tSafeCRT_AssertFuncPtr)0x0) {
      (*sMBUSafeCRTAssertFunc)
                ("\"(string != NULL)\"","SafeCRT assert failed",
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/safecrt/sscanf.c"
                 ,0x53);
    }
    inputfn_local._4_4_ = -1;
  }
  return inputfn_local._4_4_;
}

Assistant:

static int __cdecl vnscan_fn (
        INPUTFN inputfn,
        const char *string,
        size_t count,
        const char *format,
        va_list arglist
        )
{
        miniFILE str;
        miniFILE *infile = &str;
        int retval;
        size_t length = strlen(string);

        _VALIDATE_RETURN( (string != NULL), EINVAL, EOF);
        _VALIDATE_RETURN( (format != NULL), EINVAL, EOF);

        infile->_flag = _IOREAD|_IOSTRG|_IOMYBUF;
        infile->_ptr = infile->_base = (char *) string;

        if ( count > length )
        {
            count = length;
        }

        if(count>(INT_MAX/sizeof(char)))
        {
            /* old-style functions allow any large value to mean unbounded */
            infile->_cnt = INT_MAX;
        }
        else
        {
            infile->_cnt = (int)count*sizeof(char);
        }

        retval = (inputfn(infile, ( const unsigned char* )format, arglist));

        return(retval);
}